

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

InvalidSyntaxNode * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::detail::InvalidSyntaxNode,slang::syntax::detail::InvalidSyntaxNode_const&>
          (BumpAllocator *this,InvalidSyntaxNode *args)

{
  SyntaxNode *pSVar1;
  undefined4 uVar2;
  InvalidSyntaxNode *pIVar3;
  
  pIVar3 = (InvalidSyntaxNode *)allocate(this,0x18,8);
  uVar2 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
  pSVar1 = (args->super_SyntaxNode).parent;
  (pIVar3->super_SyntaxNode).kind = (args->super_SyntaxNode).kind;
  *(undefined4 *)&(pIVar3->super_SyntaxNode).field_0x4 = uVar2;
  (pIVar3->super_SyntaxNode).parent = pSVar1;
  (pIVar3->super_SyntaxNode).previewNode = (args->super_SyntaxNode).previewNode;
  return pIVar3;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }